

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

void __thiscall
helics::RandomDropFilterOperation::set
          (RandomDropFilterOperation *this,string_view property,double val)

{
  int iVar1;
  size_type __rlen;
  
  if (property._M_len == 4) {
    iVar1 = bcmp(property._M_str,"prob",4);
  }
  else {
    if (property._M_len != 8) {
      return;
    }
    iVar1 = bcmp(property._M_str,"dropprob",8);
  }
  if (iVar1 == 0) {
    LOCK();
    (this->dropProb).super___atomic_float<double>._M_fp = val;
    UNLOCK();
  }
  return;
}

Assistant:

void RandomDropFilterOperation::set(std::string_view property, double val)
{
    if ((property == "dropprob") || (property == "prob")) {
        dropProb = val;
    }
}